

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22460c::BNTest_NonMinimal_Test::TestBody(BNTest_NonMinimal_Test *this)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  char *pcVar4;
  BIGNUM *pBVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer pcVar8;
  BIO_METHOD *pBVar9;
  BIO *pBVar10;
  pointer pbVar11;
  BN_CTX *pBVar12;
  BN_MONT_CTX *pBVar13;
  pointer pbVar14;
  pointer pbVar15;
  char *in_R9;
  AssertHelper local_fc0;
  Message local_fb8;
  undefined1 local_fb0 [8];
  AssertionResult gtest_ar_29;
  Message local_f98;
  undefined1 local_f90 [8];
  AssertionResult gtest_ar_28;
  Message local_f78;
  undefined1 local_f70 [8];
  AssertionResult gtest_ar_27;
  Message local_f58;
  undefined1 local_f50 [8];
  AssertionResult gtest_ar_26;
  Message local_f38;
  int local_f30 [2];
  undefined1 local_f28 [8];
  AssertionResult gtest_ar_25;
  Message local_f10;
  int local_f08 [2];
  undefined1 local_f00 [8];
  AssertionResult gtest_ar_24;
  Message local_ee8;
  int local_ee0 [2];
  undefined1 local_ed8 [8];
  AssertionResult gtest_ar_23;
  Message local_ec0;
  undefined1 local_eb8 [8];
  AssertionResult gtest_ar_22;
  Message local_ea0;
  undefined1 local_e98 [8];
  AssertionResult gtest_ar_21;
  Message local_e80;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_e48;
  Message local_e40;
  undefined1 local_e38 [8];
  AssertionResult gtest_ar__37;
  UniquePtr<BN_MONT_CTX> mont4;
  AssertHelper local_e00;
  Message local_df8;
  undefined1 local_df0 [8];
  AssertionResult gtest_ar__36;
  UniquePtr<BN_MONT_CTX> mont3;
  AssertHelper local_db8;
  Message local_db0;
  int local_da4;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar__35;
  AssertHelper local_d70;
  Message local_d68;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar__34;
  UniquePtr<BN_MONT_CTX> mont2;
  AssertHelper local_d28;
  Message local_d20;
  undefined1 local_d18 [8];
  AssertionResult gtest_ar__33;
  UniquePtr<BN_MONT_CTX> mont;
  AssertHelper local_ce0;
  Message local_cd8;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar__32;
  UniquePtr<BIGNUM> p;
  AssertHelper local_c98;
  Message local_c90;
  int local_c84;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar__31;
  Message local_c68;
  int local_c5c;
  undefined1 local_c58 [8];
  AssertionResult gtest_ar_19;
  AssertHelper local_c28;
  Message local_c20;
  int local_c14;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_be0;
  Message local_bd8;
  int local_bcc;
  undefined1 local_bc8 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_b98;
  Message local_b90;
  bool local_b81;
  undefined1 local_b80 [8];
  AssertionResult gtest_ar__28;
  Message local_b68;
  int local_b5c;
  undefined1 local_b58 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_b28;
  Message local_b20;
  int local_b14;
  undefined1 local_b10 [8];
  AssertionResult gtest_ar__27;
  Message local_af8;
  Bytes local_af0;
  string_view local_ae0;
  Bytes local_ad0;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar_17;
  AssertHelper local_a90;
  Message local_a88;
  int local_a7c;
  undefined1 local_a78 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_a48;
  Message local_a40;
  int local_a34;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_a00;
  Message local_9f8;
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar__24;
  Message local_9d8;
  Bytes local_9d0;
  string_view local_9c0;
  Bytes local_9b0;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_970;
  Message local_968;
  int local_95c;
  undefined1 local_958 [8];
  AssertionResult gtest_ar__23;
  size_t len;
  uint8_t *ptr;
  AssertHelper local_918;
  Message local_910;
  int local_904;
  undefined1 local_900 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_8d0;
  Message local_8c8;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar__21;
  UniquePtr<BIO> bio;
  Message local_8a0;
  undefined1 local_898 [8];
  AssertionResult gtest_ar_15;
  Message local_880;
  undefined1 local_878 [8];
  AssertionResult gtest_ar_14;
  UniquePtr<char> hex;
  AssertHelper local_840;
  Message local_838;
  bool local_829;
  undefined1 local_828 [8];
  AssertionResult gtest_ar__20;
  Message local_810;
  uint local_808 [2];
  undefined1 local_800 [8];
  AssertionResult gtest_ar_13;
  Message local_7e8;
  uint local_7e0 [2];
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_12;
  Message local_7c0;
  int local_7b8;
  int local_7b4;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_11;
  Message local_798;
  int local_790;
  int local_78c;
  undefined1 local_788 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_758;
  Message local_750;
  bool local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar__19;
  Message local_728;
  int local_720;
  int local_71c;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_9;
  Message local_700;
  int local_6f8;
  int local_6f4;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_6c0;
  Message local_6b8;
  bool local_6a9;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar__18;
  Message local_690;
  int local_688;
  int local_684;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_7;
  Message local_668;
  int local_660;
  int local_65c;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_628;
  Message local_620;
  bool local_611;
  undefined1 local_610 [8];
  AssertionResult gtest_ar__17;
  Message local_5f8;
  int local_5f0;
  int local_5ec;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar_5;
  Message local_5d0;
  int local_5c8;
  int local_5c4;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_590;
  Message local_588;
  int local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_548;
  Message local_540;
  int local_534;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__15;
  Message local_518;
  uint local_50c;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_4d8;
  Message local_4d0;
  int local_4c4;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__14;
  uint64_t v;
  Message local_4a0;
  ulong local_498;
  uint local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_458;
  Message local_450;
  int local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_410;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__12;
  Message local_3e0;
  int local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_3a0;
  Message local_398;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__11;
  Message local_370;
  int local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar;
  AssertHelper local_330;
  Message local_328;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__10;
  int iStack_300;
  ScopedTrace gtest_trace_2544;
  size_t width;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__9;
  UniquePtr<BIGNUM> zero;
  AssertHelper local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_248;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<BIGNUM> two_exp_256;
  AssertHelper local_200;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<BIGNUM> forty_two;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<BIGNUM> eight;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<BIGNUM> ten_copy;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> ten;
  BNTest_NonMinimal_Test *this_local;
  
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pBVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x82b083,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x9d9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pBVar3 = (BIGNUM *)
             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_84 = BN_set_word(pBVar3,10);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_80,&local_84,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&ten_copy,(internal *)local_80,
                 (AssertionResult *)"BN_set_word(ten.get(), 10)","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x9da,pcVar4);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&ten_copy);
      testing::Message::~Message(&local_90);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pBVar3 = (BIGNUM *)
               std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      pBVar3 = BN_dup(pBVar3);
      std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (pointer)pBVar3);
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&eight,(internal *)local_d0,(AssertionResult *)"ten_copy","false",
                   "true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x9dd,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&eight);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pBVar3 = BN_new();
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (pointer)pBVar3);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_118,
                     (AssertionResult *)"eight","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x9e0,pcVar4);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pBVar3 = (BIGNUM *)
                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
          local_15c = BN_set_word(pBVar3,8);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_158,&local_15c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&forty_two,(internal *)local_158,
                       (AssertionResult *)"BN_set_word(eight.get(), 8)","false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x9e1,pcVar4);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&forty_two);
            testing::Message::~Message(&local_168);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pBVar3 = BN_new();
            std::unique_ptr<bignum_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (pointer)pBVar3);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1a8,
                       (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1a8,
                         (AssertionResult *)"forty_two","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x9e4,pcVar4);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b0);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pBVar3 = (BIGNUM *)
                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              local_1ec = BN_set_word(pBVar3,0x2a);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1e8,&local_1ec,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
              if (!bVar1) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&two_exp_256,(internal *)local_1e8,
                           (AssertionResult *)"BN_set_word(forty_two.get(), 42)","false","true",
                           in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x9e5,pcVar4);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string((string *)&two_exp_256);
                testing::Message::~Message(&local_1f8);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pBVar3 = BN_new();
                std::unique_ptr<bignum_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           (pointer)pBVar3);
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                          ((AssertionResult *)local_238,
                           (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_,
                           (type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_238);
                if (!bVar1) {
                  testing::Message::Message(&local_240);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_238,
                             (AssertionResult *)"two_exp_256","false","true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x9e8,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_248,&local_240);
                  testing::internal::AssertHelper::~AssertHelper(&local_248);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_240);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pBVar3 = (BIGNUM *)
                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__7.message_);
                  pBVar5 = BN_value_one();
                  local_27c = BN_lshift(pBVar3,pBVar5,0x100);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_278,&local_27c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_278);
                  if (!bVar1) {
                    testing::Message::Message(&local_288);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&zero,(internal *)local_278,
                               (AssertionResult *)
                               "BN_lshift(two_exp_256.get(), BN_value_one(), 256)","false","true",
                               in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_290,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9e9,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_290,&local_288);
                    testing::internal::AssertHelper::~AssertHelper(&local_290);
                    std::__cxx11::string::~string((string *)&zero);
                    testing::Message::~Message(&local_288);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    pBVar3 = BN_new();
                    std::unique_ptr<bignum_st,bssl::internal::Deleter>::
                    unique_ptr<bssl::internal::Deleter,void>
                              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)
                               &gtest_ar__9.message_,(pointer)pBVar3);
                    testing::AssertionResult::
                    AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                              ((AssertionResult *)local_2c8,
                               (unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                               &gtest_ar__9.message_,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2c8);
                    if (!bVar1) {
                      testing::Message::Message(&local_2d0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&width,(internal *)local_2c8,(AssertionResult *)0x81d092,
                                 "false","true",in_R9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_2d8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0x9ec,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
                      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
                      std::__cxx11::string::~string((string *)&width);
                      testing::Message::~Message(&local_2d0);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__9.message_);
                      BN_zero(pbVar6);
                      for (_iStack_300 = 1; _iStack_300 < 10; _iStack_300 = _iStack_300 + 1) {
                        testing::ScopedTrace::ScopedTrace<unsigned_long>
                                  ((ScopedTrace *)
                                   ((long)&gtest_ar__10.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 7),
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x9f0,(unsigned_long *)&stack0xfffffffffffffd00);
                        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_31c = bn_resize_words(pbVar6,_iStack_300);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_318,&local_31c,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_318);
                        if (!bVar1) {
                          testing::Message::Message(&local_328);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar.message_,(internal *)local_318,
                                     (AssertionResult *)"bn_resize_words(ten.get(), width)","false",
                                     "true",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_330,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x9f2,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_330,&local_328);
                          testing::internal::AssertHelper::~AssertHelper(&local_330);
                          std::__cxx11::string::~string((string *)&gtest_ar.message_);
                          testing::Message::~Message(&local_328);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                        local_364 = iStack_300;
                        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator->
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_360,"static_cast<int>(width)","ten->width",
                                   &local_364,&pbVar6->width);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_360);
                        if (!bVar1) {
                          testing::Message::Message(&local_370);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_360);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x9f3,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__11.message_,&local_370);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__11.message_);
                          testing::Message::~Message(&local_370);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__9.message_);
                        local_38c = bn_resize_words(pbVar6,_iStack_300);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_388,&local_38c,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_388);
                        if (!bVar1) {
                          testing::Message::Message(&local_398);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar_1.message_,(internal *)local_388,
                                     (AssertionResult *)"bn_resize_words(zero.get(), width)","false"
                                     ,"true",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_3a0,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x9f4,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
                          testing::internal::AssertHelper::~AssertHelper(&local_3a0);
                          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                          testing::Message::~Message(&local_398);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
                        local_3d4 = iStack_300;
                        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator->
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__9.message_);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_3d0,"static_cast<int>(width)","zero->width",
                                   &local_3d4,&pbVar6->width);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3d0);
                        if (!bVar1) {
                          testing::Message::Message(&local_3e0);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_3d0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__12.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x9f5,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__12.message_,&local_3e0);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__12.message_);
                          testing::Message::~Message(&local_3e0);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
                        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_3fc = BN_abs_is_word(pbVar6,10);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_3f8,&local_3fc,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3f8);
                        if (!bVar1) {
                          testing::Message::Message(&local_408);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__13.message_,(internal *)local_3f8,
                                     (AssertionResult *)"BN_abs_is_word(ten.get(), 10)","false",
                                     "true",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_410,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x9f7,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_410,&local_408);
                          testing::internal::AssertHelper::~AssertHelper(&local_410);
                          std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                          testing::Message::~Message(&local_408);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
                        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_444 = BN_is_word(pbVar6,10);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_440,&local_444,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_440);
                        if (!bVar1) {
                          testing::Message::Message(&local_450);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar_2.message_,(internal *)local_440,
                                     (AssertionResult *)"BN_is_word(ten.get(), 10)","false","true",
                                     in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_458,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x9f8,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_458,&local_450);
                          testing::internal::AssertHelper::~AssertHelper(&local_458);
                          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                          testing::Message::~Message(&local_450);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
                        local_48c = 10;
                        pBVar3 = (BIGNUM *)
                                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_498 = BN_get_word(pBVar3);
                        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                                  ((EqHelper *)local_488,"10u","BN_get_word(ten.get())",&local_48c,
                                   &local_498);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_488);
                        if (!bVar1) {
                          testing::Message::Message(&local_4a0);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_488);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&v,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x9f9,pcVar4);
                          testing::internal::AssertHelper::operator=((AssertHelper *)&v,&local_4a0);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v);
                          testing::Message::~Message(&local_4a0);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
                        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_4c4 = BN_get_u64(pbVar6,(uint64_t *)&gtest_ar__14.message_);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_4c0,&local_4c4,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_4c0);
                        if (!bVar1) {
                          testing::Message::Message(&local_4d0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar_3.message_,(internal *)local_4c0,
                                     (AssertionResult *)"BN_get_u64(ten.get(), &v)","false","true",
                                     in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_4d8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x9fb,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
                          testing::internal::AssertHelper::~AssertHelper(&local_4d8);
                          std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                          testing::Message::~Message(&local_4d0);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_50c = 10;
                          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                                    ((EqHelper *)local_508,"10u","v",&local_50c,
                                     (unsigned_long *)&gtest_ar__14.message_);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_508);
                          if (!bVar1) {
                            testing::Message::Message(&local_518);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_508);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__15.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x9fc,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__15.message_,&local_518);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__15.message_);
                            testing::Message::~Message(&local_518);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
                          pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__2.message_);
                          local_534 = BN_equal_consttime(pbVar6,pbVar7);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_530,&local_534,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_530);
                          if (!bVar1) {
                            testing::Message::Message(&local_540);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__16.message_,(internal *)local_530,
                                       (AssertionResult *)
                                       "BN_equal_consttime(ten.get(), ten_copy.get())","false",
                                       "true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_548,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x9fe,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_548,&local_540);
                            testing::internal::AssertHelper::~AssertHelper(&local_548);
                            std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                            testing::Message::~Message(&local_540);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
                          pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__2.message_);
                          pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          local_57c = BN_equal_consttime(pbVar6,pbVar7);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_578,&local_57c,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_578);
                          if (!bVar1) {
                            testing::Message::Message(&local_588);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_4.message_,(internal *)local_578,
                                       (AssertionResult *)
                                       "BN_equal_consttime(ten_copy.get(), ten.get())","false",
                                       "true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_590,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x9ff,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_590,&local_588);
                            testing::internal::AssertHelper::~AssertHelper(&local_590);
                            std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                            testing::Message::~Message(&local_588);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__2.message_);
                          local_5c4 = BN_cmp(pBVar3,pBVar5);
                          local_5c8 = 0;
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_5c0,"BN_cmp(ten.get(), ten_copy.get())","0",
                                     &local_5c4,&local_5c8);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_5c0);
                          if (!bVar1) {
                            testing::Message::Message(&local_5d0);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_5c0);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa00,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_5.message_,&local_5d0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_5.message_);
                            testing::Message::~Message(&local_5d0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__2.message_);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          local_5ec = BN_cmp(pBVar3,pBVar5);
                          local_5f0 = 0;
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_5e8,"BN_cmp(ten_copy.get(), ten.get())","0",
                                     &local_5ec,&local_5f0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_5e8);
                          if (!bVar1) {
                            testing::Message::Message(&local_5f8);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_5e8);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa01,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__17.message_,&local_5f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__17.message_);
                            testing::Message::~Message(&local_5f8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
                          pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__3.message_);
                          iVar2 = BN_equal_consttime(pbVar6,pbVar7);
                          local_611 = iVar2 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_610,&local_611,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_610);
                          if (!bVar1) {
                            testing::Message::Message(&local_620);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_6.message_,(internal *)local_610,
                                       (AssertionResult *)
                                       "BN_equal_consttime(ten.get(), eight.get())","true","false",
                                       in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_628,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa03,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_628,&local_620);
                            testing::internal::AssertHelper::~AssertHelper(&local_628);
                            std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
                            testing::Message::~Message(&local_620);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__3.message_);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          local_65c = BN_cmp(pBVar3,pBVar5);
                          local_660 = 0;
                          testing::internal::CmpHelperLT<int,int>
                                    ((internal *)local_658,"BN_cmp(eight.get(), ten.get())","0",
                                     &local_65c,&local_660);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_658);
                          if (!bVar1) {
                            testing::Message::Message(&local_668);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_658);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa04,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_7.message_,&local_668);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_7.message_);
                            testing::Message::~Message(&local_668);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__3.message_);
                          local_684 = BN_cmp(pBVar3,pBVar5);
                          local_688 = 0;
                          testing::internal::CmpHelperGT<int,int>
                                    ((internal *)local_680,"BN_cmp(ten.get(), eight.get())","0",
                                     &local_684,&local_688);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_680);
                          if (!bVar1) {
                            testing::Message::Message(&local_690);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_680);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__18.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa05,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__18.message_,&local_690);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__18.message_);
                            testing::Message::~Message(&local_690);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
                          pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__5.message_);
                          iVar2 = BN_equal_consttime(pbVar6,pbVar7);
                          local_6a9 = iVar2 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_6a8,&local_6a9,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_6a8);
                          if (!bVar1) {
                            testing::Message::Message(&local_6b8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_8.message_,(internal *)local_6a8,
                                       (AssertionResult *)
                                       "BN_equal_consttime(ten.get(), forty_two.get())","true",
                                       "false",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_6c0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa07,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
                            testing::internal::AssertHelper::~AssertHelper(&local_6c0);
                            std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
                            testing::Message::~Message(&local_6b8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__5.message_);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          local_6f4 = BN_cmp(pBVar3,pBVar5);
                          local_6f8 = 0;
                          testing::internal::CmpHelperGT<int,int>
                                    ((internal *)local_6f0,"BN_cmp(forty_two.get(), ten.get())","0",
                                     &local_6f4,&local_6f8);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_6f0);
                          if (!bVar1) {
                            testing::Message::Message(&local_700);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_6f0);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa08,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_9.message_,&local_700);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_9.message_);
                            testing::Message::~Message(&local_700);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__5.message_);
                          local_71c = BN_cmp(pBVar3,pBVar5);
                          local_720 = 0;
                          testing::internal::CmpHelperLT<int,int>
                                    ((internal *)local_718,"BN_cmp(ten.get(), forty_two.get())","0",
                                     &local_71c,&local_720);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_718);
                          if (!bVar1) {
                            testing::Message::Message(&local_728);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_718);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__19.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa09,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__19.message_,&local_728);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__19.message_);
                            testing::Message::~Message(&local_728);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
                          pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__7.message_);
                          iVar2 = BN_equal_consttime(pbVar6,pbVar7);
                          local_741 = iVar2 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_740,&local_741,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_740);
                          if (!bVar1) {
                            testing::Message::Message(&local_750);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_10.message_,(internal *)local_740,
                                       (AssertionResult *)
                                       "BN_equal_consttime(ten.get(), two_exp_256.get())","true",
                                       "false",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_758,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa0b,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_758,&local_750);
                            testing::internal::AssertHelper::~AssertHelper(&local_758);
                            std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
                            testing::Message::~Message(&local_750);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__7.message_);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          local_78c = BN_cmp(pBVar3,pBVar5);
                          local_790 = 0;
                          testing::internal::CmpHelperGT<int,int>
                                    ((internal *)local_788,"BN_cmp(two_exp_256.get(), ten.get())",
                                     "0",&local_78c,&local_790);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_788);
                          if (!bVar1) {
                            testing::Message::Message(&local_798);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_788);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa0c,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_11.message_,&local_798);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_11.message_);
                            testing::Message::~Message(&local_798);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__7.message_);
                          local_7b4 = BN_cmp(pBVar3,pBVar5);
                          local_7b8 = 0;
                          testing::internal::CmpHelperLT<int,int>
                                    ((internal *)local_7b0,"BN_cmp(ten.get(), two_exp_256.get())",
                                     "0",&local_7b4,&local_7b8);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_7b0);
                          if (!bVar1) {
                            testing::Message::Message(&local_7c0);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_7b0);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa0d,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_12.message_,&local_7c0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_12.message_);
                            testing::Message::~Message(&local_7c0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
                          local_7e0[1] = 4;
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          local_7e0[0] = BN_num_bits(pBVar3);
                          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                                    ((EqHelper *)local_7d8,"4u","BN_num_bits(ten.get())",
                                     local_7e0 + 1,local_7e0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_7d8);
                          if (!bVar1) {
                            testing::Message::Message(&local_7e8);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_7d8);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa0f,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_7e8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_7e8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
                          local_808[1] = 1;
                          pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          local_808[0] = BN_num_bytes(pbVar6);
                          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                                    ((EqHelper *)local_800,"1u","BN_num_bytes(ten.get())",
                                     local_808 + 1,local_808);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_800);
                          if (!bVar1) {
                            testing::Message::Message(&local_810);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_800);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__20.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa10,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__20.message_,&local_810);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__20.message_);
                            testing::Message::~Message(&local_810);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
                          pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          iVar2 = BN_is_pow2(pbVar6);
                          local_829 = iVar2 == 0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_828,&local_829,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_828);
                          if (!bVar1) {
                            testing::Message::Message(&local_838);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&hex,(internal *)local_828,
                                       (AssertionResult *)"BN_is_pow2(ten.get())","true","false",
                                       in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_840,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa11,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_840,&local_838);
                            testing::internal::AssertHelper::~AssertHelper(&local_840);
                            std::__cxx11::string::~string((string *)&hex);
                            testing::Message::~Message(&local_838);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          pcVar4 = BN_bn2hex(pBVar3);
                          std::unique_ptr<char,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<char,bssl::internal::Deleter> *)
                                     &gtest_ar_14.message_,pcVar4);
                          pcVar8 = std::unique_ptr<char,_bssl::internal::Deleter>::get
                                             ((unique_ptr<char,_bssl::internal::Deleter> *)
                                              &gtest_ar_14.message_);
                          testing::internal::CmpHelperSTREQ
                                    ((internal *)local_878,"\"0a\"","hex.get()","0a",pcVar8);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_878);
                          if (!bVar1) {
                            testing::Message::Message(&local_880);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_878);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa14,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_15.message_,&local_880);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_15.message_);
                            testing::Message::~Message(&local_880);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
                          pBVar3 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__9.message_);
                          pcVar4 = BN_bn2hex(pBVar3);
                          std::unique_ptr<char,_bssl::internal::Deleter>::reset
                                    ((unique_ptr<char,_bssl::internal::Deleter> *)
                                     &gtest_ar_14.message_,pcVar4);
                          pcVar8 = std::unique_ptr<char,_bssl::internal::Deleter>::get
                                             ((unique_ptr<char,_bssl::internal::Deleter> *)
                                              &gtest_ar_14.message_);
                          testing::internal::CmpHelperSTREQ
                                    ((internal *)local_898,"\"0\"","hex.get()","0",pcVar8);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_898);
                          if (!bVar1) {
                            testing::Message::Message(&local_8a0);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_898);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&bio,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa16,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&bio,&local_8a0);
                            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bio);
                            testing::Message::~Message(&local_8a0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
                          pBVar9 = BIO_s_mem();
                          pBVar10 = BIO_new(pBVar9);
                          std::unique_ptr<bio_st,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<bio_st,bssl::internal::Deleter> *)
                                     &gtest_ar__21.message_,(pointer)pBVar10);
                          testing::AssertionResult::
                          AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                                    ((AssertionResult *)local_8c0,
                                     (unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__21.message_,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_8c0);
                          if (!bVar1) {
                            testing::Message::Message(&local_8c8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__22.message_,(internal *)local_8c0,
                                       (AssertionResult *)0x8a2d4f,"false","true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_8d0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa19,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_8d0,&local_8c8);
                            testing::internal::AssertHelper::~AssertHelper(&local_8d0);
                            std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
                            testing::Message::~Message(&local_8c8);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            pbVar11 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__21.message_);
                            pBVar3 = (BIGNUM *)
                                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                &gtest_ar_.message_);
                            local_904 = BN_print(pbVar11,pBVar3);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_900,&local_904,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_900);
                            if (!bVar1) {
                              testing::Message::Message(&local_910);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&ptr,(internal *)local_900,
                                         (AssertionResult *)"BN_print(bio.get(), ten.get())","false"
                                         ,"true",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_918,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                         ,0xa1a,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_918,&local_910);
                              testing::internal::AssertHelper::~AssertHelper(&local_918);
                              std::__cxx11::string::~string((string *)&ptr);
                              testing::Message::~Message(&local_910);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_900)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              pbVar11 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                                   &gtest_ar__21.message_);
                              local_95c = BIO_mem_contents(pbVar11,(uint8_t **)&len,
                                                           (size_t *)&gtest_ar__23.message_);
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_958,&local_95c,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_958);
                              if (!bVar1) {
                                testing::Message::Message(&local_968);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar_16.message_,(internal *)local_958,
                                           (AssertionResult *)
                                           "BIO_mem_contents(bio.get(), &ptr, &len)","false","true",
                                           in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_970,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                           ,0xa1d,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_970,&local_968);
                                testing::internal::AssertHelper::~AssertHelper(&local_970);
                                std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
                                testing::Message::~Message(&local_968);
                              }
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_958);
                              if (gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                std::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view(&local_9c0,anon_var_dwarf_ac099 + 0xc);
                                Bytes::Bytes(&local_9b0,local_9c0);
                                Bytes::Bytes(&local_9d0,(uint8_t *)len,
                                             (size_t)gtest_ar__23.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                          ((EqHelper *)local_9a0,"Bytes(\"a\")","Bytes(ptr, len)",
                                           &local_9b0,&local_9d0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_9a0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_9d8);
                                  pcVar4 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_9a0);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar__24.message_,kNonFatalFailure
                                             ,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                             ,0xa21,pcVar4);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar__24.message_,&local_9d8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar__24.message_);
                                  testing::Message::~Message(&local_9d8);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_9a0);
                                pBVar9 = BIO_s_mem();
                                pBVar10 = BIO_new(pBVar9);
                                std::unique_ptr<bio_st,_bssl::internal::Deleter>::reset
                                          ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__21.message_,(pointer)pBVar10);
                                testing::AssertionResult::
                                AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                                          ((AssertionResult *)local_9f0,
                                           (unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__21.message_,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_9f0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_9f8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__25.message_,(internal *)local_9f0,
                                             (AssertionResult *)0x8a2d4f,"false","true",in_R9);
                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_a00,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                             ,0xa24,pcVar4);
                                  testing::internal::AssertHelper::operator=(&local_a00,&local_9f8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_a00);
                                  std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
                                  testing::Message::~Message(&local_9f8);
                                }
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_9f0);
                                if (gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  pbVar11 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                                      ((unique_ptr<bio_st,_bssl::internal::Deleter>
                                                        *)&gtest_ar__21.message_);
                                  pBVar3 = (BIGNUM *)
                                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                     ((
                                                  unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__9.message_);
                                  local_a34 = BN_print(pbVar11,pBVar3);
                                  testing::AssertionResult::AssertionResult<int>
                                            ((AssertionResult *)local_a30,&local_a34,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_a30);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_a40);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&gtest_ar__26.message_,
                                               (internal *)local_a30,
                                               (AssertionResult *)"BN_print(bio.get(), zero.get())",
                                               "false","true",in_R9);
                                    pcVar4 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_a48,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa25,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              (&local_a48,&local_a40);
                                    testing::internal::AssertHelper::~AssertHelper(&local_a48);
                                    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
                                    testing::Message::~Message(&local_a40);
                                  }
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_a30);
                                  if (gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    pbVar11 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                                        ((
                                                  unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__21.message_);
                                    local_a7c = BIO_mem_contents(pbVar11,(uint8_t **)&len,
                                                                 (size_t *)&gtest_ar__23.message_);
                                    testing::AssertionResult::AssertionResult<int>
                                              ((AssertionResult *)local_a78,&local_a7c,(type *)0x0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_a78);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_a88);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&gtest_ar_17.message_,
                                                 (internal *)local_a78,
                                                 (AssertionResult *)
                                                 "BIO_mem_contents(bio.get(), &ptr, &len)","false",
                                                 "true",in_R9);
                                      pcVar4 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_a90,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                 ,0xa26,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                (&local_a90,&local_a88);
                                      testing::internal::AssertHelper::~AssertHelper(&local_a90);
                                      std::__cxx11::string::~string((string *)&gtest_ar_17.message_)
                                      ;
                                      testing::Message::~Message(&local_a88);
                                    }
                                    gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_a78);
                                    if (gtest_ar__1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(&local_ae0,"0");
                                      Bytes::Bytes(&local_ad0,local_ae0);
                                      Bytes::Bytes(&local_af0,(uint8_t *)len,
                                                   (size_t)gtest_ar__23.message_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                                ((EqHelper *)local_ac0,"Bytes(\"0\")",
                                                 "Bytes(ptr, len)",&local_ad0,&local_af0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_ac0);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_af8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_ac0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar__27.message_,
                                                   kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                  ,0xa27,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar__27.message_,&local_af8
                                                  );
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar__27.message_);
                                        testing::Message::~Message(&local_af8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_ac0);
                                      gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ = 0;
                                    }
                                  }
                                }
                              }
                            }
                          }
                          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__21.message_);
                          std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
                                    ((unique_ptr<char,_bssl::internal::Deleter> *)
                                     &gtest_ar_14.message_);
                        }
                        testing::ScopedTrace::~ScopedTrace
                                  ((ScopedTrace *)
                                   ((long)&gtest_ar__10.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 7));
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ != 0) goto LAB_003e25a0;
                      }
                      pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      local_b14 = bn_resize_words(pbVar6,1);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_b10,&local_b14,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_b10);
                      if (!bVar1) {
                        testing::Message::Message(&local_b20);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar_18.message_,(internal *)local_b10,
                                   (AssertionResult *)"bn_resize_words(ten.get(), 1)","false","true"
                                   ,in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_b28,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa2b,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_b28,&local_b20);
                        testing::internal::AssertHelper::~AssertHelper(&local_b28);
                        std::__cxx11::string::~string((string *)&gtest_ar_18.message_);
                        testing::Message::~Message(&local_b20);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b10);
                      local_b5c = 1;
                      pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator->
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_b58,"1","ten->width",&local_b5c,&pbVar6->width);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_b58);
                      if (!bVar1) {
                        testing::Message::Message(&local_b68);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_b58);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar__28.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa2c,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar__28.message_,&local_b68);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar__28.message_);
                        testing::Message::~Message(&local_b68);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
                      pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      iVar2 = bn_resize_words(pbVar6,0);
                      local_b81 = iVar2 == 0;
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_b80,&local_b81,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_b80);
                      if (!bVar1) {
                        testing::Message::Message(&local_b90);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__29.message_,(internal *)local_b80,
                                   (AssertionResult *)"bn_resize_words(ten.get(), 0)","true","false"
                                   ,in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_b98,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa2f,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_b98,&local_b90);
                        testing::internal::AssertHelper::~AssertHelper(&local_b98);
                        std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
                        testing::Message::~Message(&local_b90);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b80);
                      pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                      local_bcc = BN_is_pow2(pbVar6);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_bc8,&local_bcc,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_bc8);
                      if (!bVar1) {
                        testing::Message::Message(&local_bd8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__30.message_,(internal *)local_bc8,
                                   (AssertionResult *)"BN_is_pow2(eight.get())","false","true",in_R9
                                  );
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_be0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa31,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_be0,&local_bd8);
                        testing::internal::AssertHelper::~AssertHelper(&local_be0);
                        std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
                        testing::Message::~Message(&local_bd8);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
                      pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                      local_c14 = bn_resize_words(pbVar6,4);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_c10,&local_c14,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_c10);
                      if (!bVar1) {
                        testing::Message::Message(&local_c20);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar_19.message_,(internal *)local_c10,
                                   (AssertionResult *)"bn_resize_words(eight.get(), 4)","false",
                                   "true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_c28,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa32,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_c28,&local_c20);
                        testing::internal::AssertHelper::~AssertHelper(&local_c28);
                        std::__cxx11::string::~string((string *)&gtest_ar_19.message_);
                        testing::Message::~Message(&local_c20);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
                      local_c5c = 4;
                      pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator->
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_c58,"4","eight->width",&local_c5c,&pbVar6->width)
                      ;
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_c58);
                      if (!bVar1) {
                        testing::Message::Message(&local_c68);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_c58);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar__31.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa33,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar__31.message_,&local_c68);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar__31.message_);
                        testing::Message::~Message(&local_c68);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c58);
                      pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                      local_c84 = BN_is_pow2(pbVar6);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_c80,&local_c84,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_c80);
                      if (!bVar1) {
                        testing::Message::Message(&local_c90);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&p,(internal *)local_c80,
                                   (AssertionResult *)"BN_is_pow2(eight.get())","false","true",in_R9
                                  );
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_c98,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa34,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_c98,&local_c90);
                        testing::internal::AssertHelper::~AssertHelper(&local_c98);
                        std::__cxx11::string::~string((string *)&p);
                        testing::Message::~Message(&local_c90);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
                      pBVar3 = BN_bin2bn(TestBody::kP,0x20,(BIGNUM *)0x0);
                      std::unique_ptr<bignum_st,bssl::internal::Deleter>::
                      unique_ptr<bssl::internal::Deleter,void>
                                ((unique_ptr<bignum_st,bssl::internal::Deleter> *)
                                 &gtest_ar__32.message_,(pointer)pBVar3);
                      testing::AssertionResult::
                      AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                                ((AssertionResult *)local_cd0,
                                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__32.message_,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_cd0);
                      if (!bVar1) {
                        testing::Message::Message(&local_cd8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&mont,(internal *)local_cd0,(AssertionResult *)0x857c63
                                   ,"false","true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_ce0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa3f,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_ce0,&local_cd8);
                        testing::internal::AssertHelper::~AssertHelper(&local_ce0);
                        std::__cxx11::string::~string((string *)&mont);
                        testing::Message::~Message(&local_cd8);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__32.message_);
                        pBVar12 = BNTest::ctx(&this->super_BNTest);
                        pBVar13 = BN_MONT_CTX_new_for_modulus(pbVar6,pBVar12);
                        std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>::
                        unique_ptr<bssl::internal::Deleter,void>
                                  ((unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter> *)
                                   &gtest_ar__33.message_,pBVar13);
                        testing::AssertionResult::
                        AssertionResult<std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>>
                                  ((AssertionResult *)local_d18,
                                   (unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__33.message_,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_d18);
                        if (!bVar1) {
                          testing::Message::Message(&local_d20);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&mont2,(internal *)local_d18,
                                     (AssertionResult *)0x86ceb4,"false","true",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_d28,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0xa45,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_d28,&local_d20);
                          testing::internal::AssertHelper::~AssertHelper(&local_d28);
                          std::__cxx11::string::~string((string *)&mont2);
                          testing::Message::~Message(&local_d20);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d18);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              &gtest_ar__32.message_);
                          pBVar12 = BNTest::ctx(&this->super_BNTest);
                          pBVar13 = BN_MONT_CTX_new_consttime(pbVar6,pBVar12);
                          std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter> *)
                                     &gtest_ar__34.message_,pBVar13);
                          testing::AssertionResult::
                          AssertionResult<std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>>
                                    ((AssertionResult *)local_d60,
                                     (unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__34.message_,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_d60);
                          if (!bVar1) {
                            testing::Message::Message(&local_d68);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__35.message_,(internal *)local_d60,
                                       (AssertionResult *)"mont2","false","true",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_d70,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa47,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_d70,&local_d68);
                            testing::internal::AssertHelper::~AssertHelper(&local_d70);
                            std::__cxx11::string::~string((string *)&gtest_ar__35.message_);
                            testing::Message::~Message(&local_d68);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                &gtest_ar__32.message_);
                            local_da4 = bn_resize_words(pbVar6,0x20);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_da0,&local_da4,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_da0);
                            if (!bVar1) {
                              testing::Message::Message(&local_db0);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&mont3,(internal *)local_da0,
                                         (AssertionResult *)"bn_resize_words(p.get(), 32)","false",
                                         "true",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_db8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                         ,0xa49,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_db8,&local_db0);
                              testing::internal::AssertHelper::~AssertHelper(&local_db8);
                              std::__cxx11::string::~string((string *)&mont3);
                              testing::Message::~Message(&local_db0);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__32.message_);
                              pBVar12 = BNTest::ctx(&this->super_BNTest);
                              pBVar13 = BN_MONT_CTX_new_for_modulus(pbVar6,pBVar12);
                              std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>::
                              unique_ptr<bssl::internal::Deleter,void>
                                        ((unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter> *)
                                         &gtest_ar__36.message_,pBVar13);
                              testing::AssertionResult::
                              AssertionResult<std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>>
                                        ((AssertionResult *)local_df0,
                                         (unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__36.message_,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_df0);
                              if (!bVar1) {
                                testing::Message::Message(&local_df8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&mont4,(internal *)local_df0,
                                           (AssertionResult *)"mont3","false","true",in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_e00,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                           ,0xa4c,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_e00,&local_df8);
                                testing::internal::AssertHelper::~AssertHelper(&local_e00);
                                std::__cxx11::string::~string((string *)&mont4);
                                testing::Message::~Message(&local_df8);
                              }
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_df0);
                              if (gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                pbVar6 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter>
                                                     *)&gtest_ar__32.message_);
                                pBVar12 = BNTest::ctx(&this->super_BNTest);
                                pBVar13 = BN_MONT_CTX_new_consttime(pbVar6,pBVar12);
                                std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>::
                                unique_ptr<bssl::internal::Deleter,void>
                                          ((unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter> *)
                                           &gtest_ar__37.message_,pBVar13);
                                testing::AssertionResult::
                                AssertionResult<std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>>
                                          ((AssertionResult *)local_e38,
                                           (unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__37.message_,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_e38);
                                if (!bVar1) {
                                  testing::Message::Message(&local_e40);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar_20.message_,(internal *)local_e38,
                                             (AssertionResult *)"mont4","false","true",in_R9);
                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_e48,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                             ,0xa4e,pcVar4);
                                  testing::internal::AssertHelper::operator=(&local_e48,&local_e40);
                                  testing::internal::AssertHelper::~AssertHelper(&local_e48);
                                  std::__cxx11::string::~string((string *)&gtest_ar_20.message_);
                                  testing::Message::~Message(&local_e40);
                                }
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_e38);
                                if (gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__34.message_);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_e78,"mont->N.width","mont2->N.width",
                                             &(pbVar14->N).width,&(pbVar15->N).width);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_e78);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_e80);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_e78);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_21.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa50,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_21.message_,&local_e80);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_21.message_);
                                    testing::Message::~Message(&local_e80);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_e78);
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__36.message_);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_e98,"mont->N.width","mont3->N.width",
                                             &(pbVar14->N).width,&(pbVar15->N).width);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_e98);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_ea0);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_e98);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_22.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa51,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_22.message_,&local_ea0);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_22.message_);
                                    testing::Message::~Message(&local_ea0);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_e98);
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__37.message_);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_eb8,"mont->N.width","mont4->N.width",
                                             &(pbVar14->N).width,&(pbVar15->N).width);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_eb8);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_ec0);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_eb8);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_23.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa52,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_23.message_,&local_ec0);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_23.message_);
                                    testing::Message::~Message(&local_ec0);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_eb8);
                                  local_ee0[1] = 0;
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__34.message_);
                                  local_ee0[0] = BN_cmp((BIGNUM *)pbVar14,(BIGNUM *)pbVar15);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_ed8,"0",
                                             "BN_cmp(&mont->RR, &mont2->RR)",local_ee0 + 1,local_ee0
                                            );
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_ed8);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_ee8);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_ed8);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_24.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa53,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_24.message_,&local_ee8);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_24.message_);
                                    testing::Message::~Message(&local_ee8);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_ed8);
                                  local_f08[1] = 0;
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__36.message_);
                                  local_f08[0] = BN_cmp((BIGNUM *)pbVar14,(BIGNUM *)pbVar15);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_f00,"0",
                                             "BN_cmp(&mont->RR, &mont3->RR)",local_f08 + 1,local_f08
                                            );
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_f00);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_f10);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_f00);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_25.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa54,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_25.message_,&local_f10);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_25.message_);
                                    testing::Message::~Message(&local_f10);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_f00);
                                  local_f30[1] = 0;
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__37.message_);
                                  local_f30[0] = BN_cmp((BIGNUM *)pbVar14,(BIGNUM *)pbVar15);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_f28,"0",
                                             "BN_cmp(&mont->RR, &mont4->RR)",local_f30 + 1,local_f30
                                            );
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_f28);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_f38);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_f28);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_26.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa55,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_26.message_,&local_f38);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_26.message_);
                                    testing::Message::~Message(&local_f38);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_f28);
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_f50,"mont->N.width","mont->RR.width",
                                             &(pbVar14->N).width,&(pbVar15->RR).width);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_f50);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_f58);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_f50);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_27.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa56,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_27.message_,&local_f58);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_27.message_);
                                    testing::Message::~Message(&local_f58);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_f50);
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__34.message_);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_f70,"mont->N.width","mont2->RR.width"
                                             ,&(pbVar14->N).width,&(pbVar15->RR).width);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_f70);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_f78);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_f70);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_28.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa57,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_28.message_,&local_f78);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_28.message_);
                                    testing::Message::~Message(&local_f78);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_f70);
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__36.message_);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_f90,"mont->N.width","mont3->RR.width"
                                             ,&(pbVar14->N).width,&(pbVar15->RR).width);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_f90);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_f98);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_f90);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_29.message_,
                                               kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa58,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_29.message_,&local_f98);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_29.message_);
                                    testing::Message::~Message(&local_f98);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_f90);
                                  pbVar14 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__33.message_);
                                  pbVar15 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                            ::operator->((
                                                  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>
                                                  *)&gtest_ar__37.message_);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_fb0,"mont->N.width","mont4->RR.width"
                                             ,&(pbVar14->N).width,&(pbVar15->RR).width);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_fb0);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_fb8);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_fb0);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_fc0,kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0xa59,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              (&local_fc0,&local_fb8);
                                    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
                                    testing::Message::~Message(&local_fb8);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_fb0);
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ = 0;
                                }
                                std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::
                                ~unique_ptr((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__37.message_);
                              }
                              std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                        ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__36.message_);
                            }
                          }
                          std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                    ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__34.message_);
                        }
                        std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__33.message_);
                      }
                      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__32.message_);
                    }
LAB_003e25a0:
                    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                               &gtest_ar__9.message_);
                  }
                }
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_);
              }
            }
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
          }
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(BNTest, NonMinimal) {
  bssl::UniquePtr<BIGNUM> ten(BN_new());
  ASSERT_TRUE(ten);
  ASSERT_TRUE(BN_set_word(ten.get(), 10));

  bssl::UniquePtr<BIGNUM> ten_copy(BN_dup(ten.get()));
  ASSERT_TRUE(ten_copy);

  bssl::UniquePtr<BIGNUM> eight(BN_new());
  ASSERT_TRUE(eight);
  ASSERT_TRUE(BN_set_word(eight.get(), 8));

  bssl::UniquePtr<BIGNUM> forty_two(BN_new());
  ASSERT_TRUE(forty_two);
  ASSERT_TRUE(BN_set_word(forty_two.get(), 42));

  bssl::UniquePtr<BIGNUM> two_exp_256(BN_new());
  ASSERT_TRUE(two_exp_256);
  ASSERT_TRUE(BN_lshift(two_exp_256.get(), BN_value_one(), 256));

  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(zero);
  BN_zero(zero.get());

  for (size_t width = 1; width < 10; width++) {
    SCOPED_TRACE(width);
    // Make |ten| and |zero| wider.
    EXPECT_TRUE(bn_resize_words(ten.get(), width));
    EXPECT_EQ(static_cast<int>(width), ten->width);
    EXPECT_TRUE(bn_resize_words(zero.get(), width));
    EXPECT_EQ(static_cast<int>(width), zero->width);

    EXPECT_TRUE(BN_abs_is_word(ten.get(), 10));
    EXPECT_TRUE(BN_is_word(ten.get(), 10));
    EXPECT_EQ(10u, BN_get_word(ten.get()));
    uint64_t v;
    ASSERT_TRUE(BN_get_u64(ten.get(), &v));
    EXPECT_EQ(10u, v);

    EXPECT_TRUE(BN_equal_consttime(ten.get(), ten_copy.get()));
    EXPECT_TRUE(BN_equal_consttime(ten_copy.get(), ten.get()));
    EXPECT_EQ(BN_cmp(ten.get(), ten_copy.get()), 0);
    EXPECT_EQ(BN_cmp(ten_copy.get(), ten.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), eight.get()));
    EXPECT_LT(BN_cmp(eight.get(), ten.get()), 0);
    EXPECT_GT(BN_cmp(ten.get(), eight.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), forty_two.get()));
    EXPECT_GT(BN_cmp(forty_two.get(), ten.get()), 0);
    EXPECT_LT(BN_cmp(ten.get(), forty_two.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), two_exp_256.get()));
    EXPECT_GT(BN_cmp(two_exp_256.get(), ten.get()), 0);
    EXPECT_LT(BN_cmp(ten.get(), two_exp_256.get()), 0);

    EXPECT_EQ(4u, BN_num_bits(ten.get()));
    EXPECT_EQ(1u, BN_num_bytes(ten.get()));
    EXPECT_FALSE(BN_is_pow2(ten.get()));

    bssl::UniquePtr<char> hex(BN_bn2hex(ten.get()));
    EXPECT_STREQ("0a", hex.get());
    hex.reset(BN_bn2hex(zero.get()));
    EXPECT_STREQ("0", hex.get());

    bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(bio);
    ASSERT_TRUE(BN_print(bio.get(), ten.get()));
    const uint8_t *ptr;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &ptr, &len));
    // TODO(davidben): |BN_print| removes leading zeros within a byte, while
    // |BN_bn2hex| rounds up to a byte, except for zero which it prints as
    // "0". Fix this discrepancy?
    EXPECT_EQ(Bytes("a"), Bytes(ptr, len));

    bio.reset(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(bio);
    ASSERT_TRUE(BN_print(bio.get(), zero.get()));
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &ptr, &len));
    EXPECT_EQ(Bytes("0"), Bytes(ptr, len));
  }

  // |ten| may be resized back down to one word.
  EXPECT_TRUE(bn_resize_words(ten.get(), 1));
  EXPECT_EQ(1, ten->width);

  // But not to zero words, which it does not fit.
  EXPECT_FALSE(bn_resize_words(ten.get(), 0));

  EXPECT_TRUE(BN_is_pow2(eight.get()));
  EXPECT_TRUE(bn_resize_words(eight.get(), 4));
  EXPECT_EQ(4, eight->width);
  EXPECT_TRUE(BN_is_pow2(eight.get()));

  // |BN_MONT_CTX| is always stored minimally and uses the same R independent of
  // input width. Additionally, mont->RR is always the same width as mont->N,
  // even if it fits in a smaller value.
  static const uint8_t kP[] = {
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x01,
  };
  bssl::UniquePtr<BIGNUM> p(BN_bin2bn(kP, sizeof(kP), nullptr));
  ASSERT_TRUE(p);

  // Test both the constant-time and variable-time functions at both minimal and
  // non-minimal |p|.
  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(p.get(), ctx()));
  ASSERT_TRUE(mont);
  bssl::UniquePtr<BN_MONT_CTX> mont2(BN_MONT_CTX_new_consttime(p.get(), ctx()));
  ASSERT_TRUE(mont2);

  ASSERT_TRUE(bn_resize_words(p.get(), 32));
  bssl::UniquePtr<BN_MONT_CTX> mont3(
      BN_MONT_CTX_new_for_modulus(p.get(), ctx()));
  ASSERT_TRUE(mont3);
  bssl::UniquePtr<BN_MONT_CTX> mont4(BN_MONT_CTX_new_consttime(p.get(), ctx()));
  ASSERT_TRUE(mont4);

  EXPECT_EQ(mont->N.width, mont2->N.width);
  EXPECT_EQ(mont->N.width, mont3->N.width);
  EXPECT_EQ(mont->N.width, mont4->N.width);
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont2->RR));
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont3->RR));
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont4->RR));
  EXPECT_EQ(mont->N.width, mont->RR.width);
  EXPECT_EQ(mont->N.width, mont2->RR.width);
  EXPECT_EQ(mont->N.width, mont3->RR.width);
  EXPECT_EQ(mont->N.width, mont4->RR.width);
}